

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

positionTy * __thiscall
DataRefs::GetUsersPlanePos
          (DataRefs *this,double *pTrueAirspeed_m,double *pTrack,double *pHeightAGL_m)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  positionTy *in_RDI;
  double *in_R8;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  positionTy *ppVar1;
  
  ppVar1 = in_RDI;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_RDI,in_stack_ffffffffffffffb8);
  memcpy(in_RDI,(void *)(in_RSI + 0xc88),0x48);
  if (in_RDX != (undefined8 *)0x0) {
    *in_RDX = *(undefined8 *)(in_RSI + 0xcd8);
  }
  if (in_RCX != (undefined8 *)0x0) {
    *in_RCX = *(undefined8 *)(in_RSI + 0xce0);
  }
  if (in_R8 != (double *)0x0) {
    *in_R8 = (double)*(int *)(in_RSI + 0xcd0) * 0.3048;
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x13bd78);
  return ppVar1;
}

Assistant:

positionTy DataRefs::GetUsersPlanePos(double* pTrueAirspeed_m,
                                      double* pTrack,
                                      double* pHeightAGL_m) const
{
    // access guarded by a lock
    std::lock_guard<std::recursive_mutex> lock(mutexDrUpdate);

    // Copy the values
    positionTy ret = lastUsersPlanePos;
    if (pTrueAirspeed_m)    *pTrueAirspeed_m    = lastUsersTrueAirspeed;
    if (pTrack)             *pTrack             = lastUsersTrack;
    if (pHeightAGL_m)       *pHeightAGL_m       = lastUsersAGL_ft * M_per_FT;

    return ret;
}